

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O1

void __thiscall trimesh::mscomplex_t::cancel_pair(mscomplex_t *this,int p,int q)

{
  pointer *pppVar1;
  pointer piVar2;
  iterator __position;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  size_type sVar6;
  size_type sVar7;
  ostream *poVar8;
  runtime_error *prVar9;
  int iVar10;
  long lVar11;
  int __c;
  int __c_00;
  int __c_01;
  undefined4 in_register_00000034;
  stringstream ss;
  uint local_1e0 [8];
  long local_1c0;
  pair<int,_int> local_1b8 [2];
  ostream local_1a8 [376];
  
  pcVar4 = index(this,(char *)CONCAT44(in_register_00000034,p),q);
  pcVar5 = index(this,(char *)(ulong)(uint)q,__c);
  uVar3 = q;
  if ((int)pcVar4 < (int)pcVar5) {
    uVar3 = p;
    p = q;
  }
  if ((long)(this->m_canc_list).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->m_canc_list).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != (long)this->m_multires_version) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Failed to ensure condition ",0x1b)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"m_multires_version == m_canc_list.size()",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"at (",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"cancel_pair",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
    poVar8 = (ostream *)std::ostream::operator<<(local_1a8,0x137);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") \n ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Message : ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\"Cannot cancel pair !! Ms complex resolution is not coarsest.\"",0x3e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)local_1e0);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar4 = index(this,(char *)(ulong)(uint)p,__c_00);
  pcVar5 = index(this,(char *)(ulong)uVar3,__c_01);
  if ((int)pcVar4 != (int)pcVar5 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Failed to ensure condition ",0x1b)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"index(p) == index(q)+1",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"at (",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"cancel_pair",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
    poVar8 = (ostream *)std::ostream::operator<<(local_1a8,0x139);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") \n ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Message : ",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"indices do not differ by 1\"",0x1c)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)local_1e0);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar11 = (long)p;
  piVar2 = (this->m_cp_pair_idx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((piVar2[lVar11] == -1) && (piVar2[(int)uVar3] == -1)) {
    local_1c0 = lVar11;
    local_1b8[0].first = uVar3;
    sVar6 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&(this->m_des_conn->
                     super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar11]._M_t,
                    (key_type_conflict *)local_1b8);
    local_1e0[0] = p;
    sVar7 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&(this->m_asc_conn->
                     super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[(int)uVar3]._M_t,local_1e0);
    if (sVar6 != sVar7) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Failed to ensure condition ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"m_des_conn[p].count(q) == m_asc_conn[q].count(p)",0x30);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"at (",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                 ,0x69);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"cancel_pair",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
      poVar8 = (ostream *)std::ostream::operator<<(local_1a8,0x13d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") \n ",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Message : ",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"p is not connected to q\"",0x19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)local_1e0);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1b8[0].first = uVar3;
    sVar6 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&(this->m_des_conn->
                     super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar11]._M_t,
                    (key_type_conflict *)local_1b8);
    if (sVar6 != 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Failed to ensure condition ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"m_des_conn[p].count(q) == 1",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"at (",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                 ,0x69);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"cancel_pair",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
      poVar8 = (ostream *)std::ostream::operator<<(local_1a8,0x13f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") \n ",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Message : ",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"\"p and q are multiply connected\"",0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)local_1e0);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    piVar2 = (this->m_cp_cancno).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    __position._M_current =
         (this->m_canc_list).
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    iVar10 = (int)((ulong)((long)__position._M_current -
                          (long)(this->m_canc_list).
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    piVar2[local_1c0] = iVar10;
    piVar2[(int)uVar3] = iVar10;
    local_1b8[0].second = uVar3;
    local_1b8[0].first = p;
    if (__position._M_current ==
        (this->m_canc_list).
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      _M_realloc_insert<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->m_canc_list
                 ,__position,local_1b8);
    }
    else {
      *__position._M_current = local_1b8[0];
      pppVar1 = &(this->m_canc_list).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    cancel_pair(this);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Failed to ensure condition ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"m_cp_pair_idx[p] == -1 && m_cp_pair_idx[q] == -1",0x30);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"at (",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
             ,0x69);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"cancel_pair",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
  poVar8 = (ostream *)std::ostream::operator<<(local_1a8,0x13b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") \n ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Message : ",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"p/q has already been paired\"",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar9,(string *)local_1e0);
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void mscomplex_t::cancel_pair ( int p, int q)
{
  order_pr_by_cp_index(*this,p,q);

  ENSURE(m_multires_version == m_canc_list.size(),
         "Cannot cancel pair !! Ms complex resolution is not coarsest.");
  ENSURE(index(p) == index(q)+1,
         "indices do not differ by 1");
  ENSURE(m_cp_pair_idx[p] == -1 && m_cp_pair_idx[q] == -1,
         "p/q has already been paired");
  ENSURE(m_des_conn[p].count(q)  == m_asc_conn[q].count(p),
         "p is not connected to q");
  ENSURE(m_des_conn[p].count(q) == 1,
         "p and q are multiply connected");

  m_cp_cancno[p] = m_canc_list.size();
  m_cp_cancno[q] = m_canc_list.size();
  m_canc_list.push_back(make_pair(p,q));

  cancel_pair();
}